

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

int array_container_intersection_cardinality(array_container_t *array1,array_container_t *array2)

{
  int32_t iVar1;
  uint uVar2;
  uint16_t *in_RSI;
  int *in_RDI;
  int threshold;
  size_t unaff_retaddr;
  int32_t card_2;
  int32_t card_1;
  int iVar3;
  int iVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar4 = *in_RDI;
  iVar3 = *(int *)in_RSI;
  if (iVar4 * 0x40 < iVar3) {
    iVar1 = intersect_skewed_uint16_cardinality
                      (_card_2,unaff_retaddr,
                       (uint16_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (size_t)in_RDI);
  }
  else if (iVar3 * 0x40 < iVar4) {
    iVar1 = intersect_skewed_uint16_cardinality
                      (_card_2,unaff_retaddr,
                       (uint16_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (size_t)in_RDI);
  }
  else {
    uVar2 = croaring_hardware_support();
    if ((uVar2 & 1) == 0) {
      iVar1 = intersect_uint16_cardinality
                        (*(uint16_t **)(in_RDI + 2),(long)iVar4,*(uint16_t **)(in_RSI + 4),
                         (long)iVar3);
    }
    else {
      iVar1 = intersect_vector16_cardinality
                        ((uint16_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (size_t)in_RDI,in_RSI,CONCAT44(iVar4,iVar3));
    }
  }
  return iVar1;
}

Assistant:

int array_container_intersection_cardinality(const array_container_t *array1,
                                             const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_cardinality(array1->array, card_1,
                                                   array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_cardinality(array2->array, card_2,
                                                   array1->array, card_1);
    } else {
#if CROARING_IS_X64
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
            return intersect_vector16_cardinality(array1->array, card_1,
                                                  array2->array, card_2);
        } else {
            return intersect_uint16_cardinality(array1->array, card_1,
                                                array2->array, card_2);
        }
#else
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
#endif
    }
}